

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.hpp
# Opt level: O2

unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true> __thiscall
duckdb::
make_uniq_base<duckdb::ParsedExpression,duckdb::ColumnRefExpression,std::__cxx11::string_const&,duckdb::BindingAlias_const&>
          (duckdb *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args,
          BindingAlias *args_1)

{
  ColumnRefExpression *this_00;
  string local_40;
  
  this_00 = (ColumnRefExpression *)operator_new(0x50);
  ::std::__cxx11::string::string((string *)&local_40,(string *)args);
  ColumnRefExpression::ColumnRefExpression(this_00,&local_40,args_1);
  *(ColumnRefExpression **)this = this_00;
  ::std::__cxx11::string::~string((string *)&local_40);
  return (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)
         (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)this;
}

Assistant:

unique_ptr<S> make_uniq_base(ARGS &&... args) { // NOLINT: mimic std style
	return unique_ptr<S>(new T(std::forward<ARGS>(args)...));
}